

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O0

void socket_disconnected_notification(void *arg)

{
  apx_socketServerConnection_t *self;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    if (*(long *)((long)arg + 0x428) == 0) {
      __assert_fail("self->base.parent != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                    ,0x116,"void socket_disconnected_notification(void *)");
    }
    apx_server_detach_connection(*(undefined8 *)((long)arg + 0x428),arg);
  }
  return;
}

Assistant:

static void socket_disconnected_notification(void* arg)
{
   apx_socketServerConnection_t* self = (apx_socketServerConnection_t*)arg;
#if APX_DEBUG_ENABLE
   printf("[SERVER-SOCKET] Client disconnected\n");
#endif
   if (self != NULL)
   {
      assert(self->base.parent != NULL);
      apx_server_detach_connection(self->base.parent, &self->base);
   }
}